

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_arc_to(plutovg_path_t *path,float rx,float ry,float angle,_Bool large_arc_flag,
                        _Bool sweep_flag,float x,float y)

{
  plutovg_path_element_t *ppVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  uint in_XMM0_Db;
  undefined1 auVar8 [16];
  undefined1 extraout_var [12];
  undefined1 auVar9 [16];
  float fVar11;
  uint in_XMM1_Db;
  undefined1 auVar12 [16];
  float fVar13;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float cp1x;
  float y3;
  float x3;
  float cp2y;
  float cp2x;
  float y2;
  float x2;
  float y1;
  float x1;
  float dy;
  float dx;
  plutovg_matrix_t matrix;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float fStack_54;
  uint uStack_50;
  uint uStack_4c;
  plutovg_matrix_t local_48;
  undefined1 auVar10 [12];
  
  local_88 = 0.0;
  local_d8 = 0.0;
  if (0 < path->num_points) {
    ppVar1 = (path->elements).data;
    lVar3 = (long)(path->elements).size;
    local_88 = ppVar1[lVar3 + -1].point.x;
    local_d8 = *(float *)((long)ppVar1 + lVar3 * 8 + -4);
  }
  if ((((rx != 0.0) || (NAN(rx))) && ((ry != 0.0 || (NAN(ry))))) &&
     ((((local_88 != x || (NAN(local_88) || NAN(x))) || (local_d8 != y)) ||
      (NAN(local_d8) || NAN(y))))) {
    local_e8 = (float)CONCAT71(in_register_00000011,sweep_flag);
    local_c8 = (undefined1  [8])(CONCAT44(ry,rx) ^ 0x8000000080000000);
    fStack_c0 = (float)(in_XMM0_Db ^ 0x80000000);
    fStack_bc = (float)(in_XMM1_Db ^ 0x80000000);
    local_b8 = (local_88 - x) * 0.5;
    local_98 = (local_d8 - y) * 0.5;
    local_78 = -angle;
    fStack_74 = (float)(in_XMM2_Db ^ 0x80000000);
    fStack_70 = (float)(in_XMM2_Dc ^ 0x80000000);
    fStack_6c = (float)(in_XMM2_Dd ^ 0x80000000);
    local_a8 = angle;
    local_60 = local_98;
    local_5c = local_b8;
    local_58 = rx;
    fStack_54 = ry;
    uStack_50 = in_XMM0_Db;
    uStack_4c = in_XMM1_Db;
    plutovg_matrix_init_rotate(&local_48,local_78);
    plutovg_matrix_map(&local_48,local_b8,local_98,&local_5c,&local_60);
    auVar15._4_4_ = fStack_54;
    auVar15._0_4_ = local_58;
    auVar15._8_4_ = uStack_50;
    auVar15._12_4_ = uStack_4c;
    _local_c8 = maxps(_local_c8,auVar15);
    fVar13 = local_c8._0_4_;
    fStack_b4 = local_c8._4_4_;
    auVar10 = local_c8._4_12_;
    auVar8._0_4_ = fVar13 * fVar13;
    auVar8._4_4_ = fStack_b4 * fStack_b4;
    auVar8._8_4_ = local_c8._8_4_ * local_c8._8_4_;
    auVar8._12_4_ = local_c8._12_4_ * local_c8._12_4_;
    auVar14._0_4_ = local_5c * local_5c;
    auVar14._4_4_ = local_60 * local_60;
    auVar14._8_8_ = 0;
    auVar15 = divps(auVar14,auVar8);
    fVar11 = auVar15._4_4_ + auVar15._0_4_;
    local_b8 = (float)(~-(uint)(1.0 < fVar11) & (uint)fStack_b4 |
                      (uint)(fStack_b4 * SQRT(fVar11)) & -(uint)(1.0 < fVar11));
    if (1.0 < fVar11) {
      local_c8._0_4_ = fVar13 * SQRT(fVar11);
      register0x00001304 = auVar10;
    }
    fStack_b0 = fStack_b4;
    fStack_ac = fStack_b4;
    plutovg_matrix_init_scale(&local_48,1.0 / local_c8._0_4_,1.0 / local_b8);
    plutovg_matrix_rotate(&local_48,local_78);
    plutovg_matrix_map(&local_48,local_88,local_d8,&local_64,&local_8c);
    plutovg_matrix_map(&local_48,x,y,&local_90,&local_94);
    fVar13 = local_90 - local_64;
    fVar16 = local_94 - local_8c;
    fVar17 = 1.0 / (fVar13 * fVar13 + fVar16 * fVar16) + -0.25;
    fVar11 = 0.0;
    if (0.0 <= fVar17) {
      fVar11 = fVar17;
    }
    fVar11 = SQRT(fVar11);
    cVar6 = SUB41(local_e8,0);
    if (large_arc_flag == (_Bool)cVar6) {
      fVar11 = -fVar11;
    }
    fVar16 = (local_90 + local_64) * 0.5 - fVar16 * fVar11;
    fVar11 = (local_94 + local_8c) * 0.5 + fVar13 * fVar11;
    local_88 = atan2f(local_8c - fVar11,local_64 - fVar16);
    local_d8 = atan2f(local_94 - fVar11,local_90 - fVar16);
    fStack_d4 = extraout_var._0_4_;
    fStack_d0 = extraout_var._4_4_;
    fStack_cc = extraout_var._8_4_;
    local_d8 = local_d8 - local_88;
    if (0.0 <= local_d8 || cVar6 != '\x01') {
      if (0.0 < local_d8 && cVar6 == '\0') {
        local_d8 = local_d8 + -6.2831855;
      }
    }
    else {
      local_d8 = local_d8 + 6.2831855;
    }
    plutovg_matrix_init_rotate(&local_48,local_a8);
    plutovg_matrix_scale(&local_48,(float)local_c8._0_4_,local_b8);
    fVar13 = ceilf(ABS(local_d8 / 1.5717964));
    iVar5 = (int)fVar13;
    local_78 = (float)(int)fVar13;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    fStack_84 = local_88;
    fStack_80 = local_88;
    fStack_7c = local_88;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    uVar4 = 0;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      auVar12._4_4_ = 0;
      auVar12._0_4_ = uVar4 + 1;
      auVar12._8_4_ = uVar4;
      auVar12._12_4_ = 0;
      auVar9._0_4_ = (float)(SUB168(auVar12 | _DAT_0013c6b0,0) - (double)DAT_0013c6b0) * local_d8;
      auVar9._4_4_ = (float)(SUB168(auVar12 | _DAT_0013c6b0,8) - DAT_0013c6b0._8_8_) * fStack_d4;
      auVar9._8_4_ = fStack_d0 * 0.0;
      auVar9._12_4_ = fStack_cc * 0.0;
      auVar2._4_4_ = fStack_74;
      auVar2._0_4_ = local_78;
      auVar2._8_4_ = fStack_70;
      auVar2._12_4_ = fStack_6c;
      auVar15 = divps(auVar9,auVar2);
      local_e8 = auVar15._0_4_ + local_88;
      fStack_e4 = auVar15._4_4_ + fStack_84;
      fStack_e0 = auVar15._8_4_ + fStack_80;
      fStack_dc = auVar15._12_4_ + fStack_7c;
      local_c8._4_4_ = fStack_e4;
      local_c8._0_4_ = fStack_e4;
      fStack_c0 = fStack_e4;
      fStack_bc = fStack_e4;
      local_a8 = tanf((local_e8 - fStack_e4) * 0.25);
      local_a8 = local_a8 * 1.3333334;
      local_f8 = cosf(local_e8);
      local_f8 = local_f8 + fVar16;
      local_fc = sinf(local_e8);
      local_fc = local_fc + fVar11;
      local_b8 = local_f8;
      fVar13 = sinf(local_e8);
      local_f0 = fVar13 * local_a8 + local_b8;
      local_b8 = local_fc;
      fVar13 = cosf(local_e8);
      local_f4 = local_b8 - fVar13 * local_a8;
      local_e8 = cosf((float)local_c8._0_4_);
      fVar13 = sinf((float)local_c8._0_4_);
      local_100 = local_e8 - fVar13 * local_a8;
      local_e8 = sinf((float)local_c8._0_4_);
      fVar13 = cosf((float)local_c8._0_4_);
      local_100 = local_100 + fVar16;
      local_ec = local_a8 * fVar13 + local_e8 + fVar11;
      plutovg_matrix_map(&local_48,local_100,local_ec,&local_100,&local_ec);
      plutovg_matrix_map(&local_48,local_f0,local_f4,&local_f0,&local_f4);
      plutovg_matrix_map(&local_48,local_f8,local_fc,&local_f8,&local_fc);
      plutovg_path_cubic_to(path,local_100,local_ec,local_f0,local_f4,local_f8,local_fc);
      uVar4 = uVar4 + 1;
    }
    return;
  }
  plutovg_path_line_to(path,x,y);
  return;
}

Assistant:

void plutovg_path_arc_to(plutovg_path_t* path, float rx, float ry, float angle, bool large_arc_flag, bool sweep_flag, float x, float y)
{
    float current_x, current_y;
    plutovg_path_get_current_point(path, &current_x, &current_y);
    if(rx == 0.f || ry == 0.f || (current_x == x && current_y == y)) {
        plutovg_path_line_to(path, x, y);
        return;
    }

    if(rx < 0.f) rx = -rx;
    if(ry < 0.f) ry = -ry;

    float dx = (current_x - x) * 0.5f;
    float dy = (current_y - y) * 0.5f;

    plutovg_matrix_t matrix;
    plutovg_matrix_init_rotate(&matrix, -angle);
    plutovg_matrix_map(&matrix, dx, dy, &dx, &dy);

    float rxrx = rx * rx;
    float ryry = ry * ry;
    float dxdx = dx * dx;
    float dydy = dy * dy;
    float radius = dxdx / rxrx + dydy / ryry;
    if(radius > 1.f) {
        rx *= sqrtf(radius);
        ry *= sqrtf(radius);
    }

    plutovg_matrix_init_scale(&matrix, 1.f / rx, 1.f / ry);
    plutovg_matrix_rotate(&matrix, -angle);

    float x1, y1;
    float x2, y2;
    plutovg_matrix_map(&matrix, current_x, current_y, &x1, &y1);
    plutovg_matrix_map(&matrix, x, y, &x2, &y2);

    float dx1 = x2 - x1;
    float dy1 = y2 - y1;
    float d = dx1 * dx1 + dy1 * dy1;
    float scale_sq = 1.f / d - 0.25f;
    if(scale_sq < 0.f) scale_sq = 0.f;
    float scale = sqrtf(scale_sq);
    if(sweep_flag == large_arc_flag)
        scale = -scale;
    dx1 *= scale;
    dy1 *= scale;

    float cx1 = 0.5f * (x1 + x2) - dy1;
    float cy1 = 0.5f * (y1 + y2) + dx1;

    float th1 = atan2f(y1 - cy1, x1 - cx1);
    float th2 = atan2f(y2 - cy1, x2 - cx1);
    float th_arc = th2 - th1;
    if(th_arc < 0.f && sweep_flag)
        th_arc += PLUTOVG_TWO_PI;
    else if(th_arc > 0.f && !sweep_flag)
        th_arc -= PLUTOVG_TWO_PI;
    plutovg_matrix_init_rotate(&matrix, angle);
    plutovg_matrix_scale(&matrix, rx, ry);
    int segments = (int)(ceilf(fabsf(th_arc / (PLUTOVG_HALF_PI + 0.001f))));
    for(int i = 0; i < segments; i++) {
        float th_start = th1 + i * th_arc / segments;
        float th_end = th1 + (i + 1) * th_arc / segments;
        float t = (8.f / 6.f) * tanf(0.25f * (th_end - th_start));

        float x3 = cosf(th_end) + cx1;
        float y3 = sinf(th_end) + cy1;

        float cp2x = x3 + t * sinf(th_end);
        float cp2y = y3 - t * cosf(th_end);

        float cp1x = cosf(th_start) - t * sinf(th_start);
        float cp1y = sinf(th_start) + t * cosf(th_start);

        cp1x += cx1;
        cp1y += cy1;

        plutovg_matrix_map(&matrix, cp1x, cp1y, &cp1x, &cp1y);
        plutovg_matrix_map(&matrix, cp2x, cp2y, &cp2x, &cp2y);
        plutovg_matrix_map(&matrix, x3, y3, &x3, &y3);

        plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, x3, y3);
    }
}